

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
ctemplate::BaseArena::BaseArena(BaseArena *this,char *first,size_t block_size,bool align_to_page)

{
  char extraout_AL;
  size_t sVar1;
  BaseArena *size;
  
  this->_vptr_BaseArena = (_func_int **)&PTR__BaseArena_0014dbe0;
  (this->status_).bytes_allocated_ = 0;
  this->remaining_ = 0;
  this->first_block_we_own_ = (uint)(first != (char *)0x0);
  this->block_size_ = block_size;
  this->freestart_ = (char *)0x0;
  this->last_alloc_ = (char *)0x0;
  this->blocks_alloced_ = 1;
  this->overflow_blocks_ =
       (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
        *)0x0;
  this->page_aligned_ = align_to_page;
  this->handle_alignment_ = 1;
  this->handle_alignment_bits_ = 0;
  this->block_size_bits_ = 0;
  if (block_size < 9) {
    __assert_fail("block_size > kDefaultAlignment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                  ,0x66,"ctemplate::BaseArena::BaseArena(char *, const size_t, bool)");
  }
  sVar1 = 0;
  do {
    sVar1 = sVar1 + 1;
  } while ((ulong)(1L << ((byte)sVar1 & 0x3f)) < block_size);
  this->block_size_bits_ = sVar1;
  size = this;
  if (first != (char *)0x0) {
    if (!align_to_page || ((ulong)first & 0x1fff) == 0) goto LAB_0012f1c4;
    ctemplate::BaseArena();
    align_to_page = (bool)extraout_AL;
  }
  if (align_to_page != false) {
    if ((block_size & 0x1fff) == 0) {
      aligned_malloc((size_t)size,(size_t)first);
    }
    ctemplate::BaseArena();
    fprintf(_stderr,"Check failed: %s\n","false");
    exit(1);
  }
  first = (char *)malloc(block_size);
LAB_0012f1c4:
  this->first_blocks_[0].mem = first;
  this->first_blocks_[0].size = block_size;
  Reset(this);
  return;
}

Assistant:

BaseArena::BaseArena(char* first, const size_t block_size, bool align_to_page)
  : remaining_(0),
    first_block_we_own_(first ? 1 : 0),
    block_size_(block_size),
    freestart_(NULL),                   // set for real in Reset()
    last_alloc_(NULL),
    blocks_alloced_(1),
    overflow_blocks_(NULL),
    page_aligned_(align_to_page),
    handle_alignment_(1),
    handle_alignment_bits_(0),
    block_size_bits_(0) {
  assert(block_size > kDefaultAlignment);

  while ((static_cast<size_t>(1) << block_size_bits_) < block_size_) {
    ++block_size_bits_;
  }

  if (page_aligned_) {
    // kPageSize must be power of 2, so make sure of this.
    CHECK(kPageSize > 0 && 0 == (kPageSize & (kPageSize - 1)))
                              << "kPageSize[ " << kPageSize << "] is not "
                              << "correctly initialized: not a power of 2.";
  }

  if (first) {
    CHECK(!page_aligned_ ||
          (reinterpret_cast<uintptr_t>(first) & (kPageSize - 1)) == 0);
    first_blocks_[0].mem = first;
  } else {
    if (page_aligned_) {
      // Make sure the blocksize is page multiple, as we need to end on a page
      // boundary.
      CHECK_EQ(block_size & (kPageSize - 1), 0) << "block_size is not a"
                                                << "multiple of kPageSize";
      first_blocks_[0].mem = reinterpret_cast<char*>(aligned_malloc(block_size_,
                                                                    kPageSize));
      PCHECK(NULL != first_blocks_[0].mem);
    } else {
      first_blocks_[0].mem = reinterpret_cast<char*>(malloc(block_size_));
    }
  }
  first_blocks_[0].size = block_size_;

  Reset();
}